

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

DockWidgetArea __thiscall QMainWindowLayout::dockWidgetArea(QMainWindowLayout *this,QWidget *widget)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QList<int> pathToWidget;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  DockWidgetArea local_24;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDockAreaLayout::indexOf
            ((QDockAreaLayout *)&DAT_aaaaaaaaaaaaaaaa,(QWidget *)&DAT_aaaaaaaaaaaaaaaa);
  bVar2 = QList<int>::isEmpty((QList<int> *)0x5f19c0);
  if (bVar2) {
    local_24 = NoDockWidgetArea;
  }
  else {
    QList<int>::first((QList<int> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    local_24 = toDockWidgetArea(0);
  }
  QList<int>::~QList((QList<int> *)0x5f19ff);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_24;
  }
  __stack_chk_fail();
}

Assistant:

Qt::DockWidgetArea QMainWindowLayout::dockWidgetArea(const QWidget *widget) const
{
    const QList<int> pathToWidget = layoutState.dockAreaLayout.indexOf(widget);
    if (pathToWidget.isEmpty())
        return Qt::NoDockWidgetArea;
    return toDockWidgetArea(pathToWidget.first());
}